

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O2

int s3phseg_read(char *fn,acmod_set_t *acmod_set,s3phseg_t **out_phseg)

{
  s3phseg_s *psVar1;
  int iVar2;
  acmod_id_t id;
  uint32 uVar3;
  acmod_id_t aVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  s3phseg_t *psVar7;
  s3phseg_t *last;
  s3phseg_s *psVar8;
  s3phseg_t *phseg;
  int score;
  uint ef;
  uint sf;
  undefined8 local_240;
  char txt [512];
  
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0x40,"Failed to open phseg file %s\n",fn);
LAB_0011d51a:
    iVar2 = -1;
  }
  else {
    local_240 = out_phseg;
    do {
      iVar2 = __isoc99_fscanf(__stream,"%511s",txt);
      if (iVar2 == 0) break;
      if (iVar2 == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                ,0x46,"Failed to read column headers from phseg file\n");
        goto LAB_0011d512;
      }
      iVar2 = bcmp(txt,"Phone",6);
    } while (iVar2 != 0);
    phseg = (s3phseg_t *)0x0;
    while ((iVar2 = feof(__stream), iVar2 == 0 &&
           (iVar2 = __isoc99_fscanf(__stream,"%u %u %d",&sf,&ef,&score), 2 < iVar2))) {
      fgets(txt,0x200,__stream);
      sVar5 = strlen(txt);
      if (txt[sVar5 - 1] == '\n') {
        txt[sVar5 - 1] = '\0';
      }
      sVar5 = strspn(txt," \t");
      pcVar6 = strchr(txt + sVar5,0x20);
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = '\0';
      }
      id = acmod_set_name2id(acmod_set,txt);
      if (id == 0xffffffff) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                ,0x60,"Unknown CI phone (%s) in phseg file\n",txt);
LAB_0011d512:
        fclose(__stream);
        goto LAB_0011d51a;
      }
      if (pcVar6 != (char *)0x0) {
        *pcVar6 = ' ';
      }
      aVar4 = id;
      if (((acmod_set->n_multi != 0) &&
          (uVar3 = acmod_set_has_attrib(acmod_set,id,"filler"), uVar3 == 0)) &&
         (aVar4 = acmod_set_name2id(acmod_set,txt), aVar4 == 0xffffffff)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                ,0x69,"Unknown triphone (%s) in phseg file\n",txt);
        aVar4 = id;
      }
      psVar7 = (s3phseg_t *)
               __ckd_calloc__(1,0x20,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                              ,0x6e);
      psVar7->next = phseg;
      psVar7->phone = aVar4;
      psVar7->sf = sf;
      psVar7->ef = ef;
      psVar7->score = score;
      phseg = psVar7;
    }
    fclose(__stream);
    if (local_240 == (s3phseg_t **)0x0) {
      s3phseg_free(phseg);
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      psVar8 = (s3phseg_s *)0x0;
      while (phseg != (s3phseg_t *)0x0) {
        psVar1 = phseg->next;
        *local_240 = phseg;
        phseg->next = psVar8;
        psVar8 = *local_240;
        phseg = psVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int
s3phseg_read(const char *fn,
	     acmod_set_t *acmod_set,
	     s3phseg_t **out_phseg)
{
	FILE *fp;
	char txt[512];
	s3phseg_t *plist = NULL;
	int n;

	if ((fp = fopen(fn, "r")) == NULL) {
		E_ERROR("Failed to open phseg file %s\n", fn);
		return S3_ERROR;
	}
	/* Should be a header of column names */
	while ((n = fscanf(fp, "%511s", txt))) {
		if (n == EOF) {
			E_ERROR("Failed to read column headers from phseg file\n");
			goto error_out;
		}
		if (!strcmp(txt, "Phone"))
			break;
	}
	/* Get each line */
	while (!feof(fp)) {
		unsigned int sf, ef;
		int score;
		acmod_id_t ci, phone;
		s3phseg_t *phseg;
		char *c, *cc;

		n = fscanf(fp, "%u %u %d", &sf, &ef, &score);
		if (n < 3) /* We probably hit EOF or "Total score" */
			break;
		fgets(txt, sizeof(txt), fp);
		/* Remove newline. */
		if (txt[strlen(txt)-1] == '\n')
			txt[strlen(txt)-1] = '\0';
		/* Find the base phone. */
		cc = txt + strspn(txt, " \t");
		if ((c = strchr(cc, ' ')))
			*c = '\0';
		if ((ci = phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
			E_ERROR("Unknown CI phone (%s) in phseg file\n", txt);
			goto error_out;
		}
		/* Restore the space and find the triphone if necessary. */
		if (c) *c = ' ';
		if (acmod_set->n_multi != 0
		    && !acmod_set_has_attrib(acmod_set, phone, "filler")) {
			if ((phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
				/* This might be too verbose. */
				E_WARN("Unknown triphone (%s) in phseg file\n", txt);
				/* Back off to CI phone. */
				phone = ci;
			}
		}
		phseg = ckd_calloc(1, sizeof(*phseg));
		phseg->next = plist;
		phseg->phone = phone;
		phseg->sf = sf;
		phseg->ef = ef;
		phseg->score = score;
		plist = phseg;
	}
	fclose(fp);
	if (out_phseg) {
		s3phseg_t *next, *last = NULL;
		/* Now reverse the list. */
		while (plist) {
			next = plist->next;
			*out_phseg = plist;
			(*out_phseg)->next = last;
			last = *out_phseg;
			plist = next;
		}
	}
	else
		s3phseg_free(plist);
	return S3_SUCCESS;
error_out:
	fclose(fp);
	return S3_ERROR;
}